

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O2

void Intp_ManResize(Intp_Man_t *p)

{
  int iVar1;
  lit *plVar2;
  char *pcVar3;
  Sto_Cls_t **ppSVar4;
  int *__s;
  int iVar5;
  size_t sVar6;
  
  iVar5 = p->nVarsAlloc;
  iVar1 = p->pCnf->nVars;
  if (iVar5 < iVar1) {
    if (iVar5 != 0) goto LAB_0071c711;
    iVar5 = 1;
    while( true ) {
      p->nVarsAlloc = iVar5;
LAB_0071c711:
      if (iVar1 <= iVar5) break;
      iVar5 = iVar5 * 2;
    }
    if (p->pTrail == (lit *)0x0) {
      plVar2 = (lit *)malloc((long)iVar5 << 2);
    }
    else {
      plVar2 = (lit *)realloc(p->pTrail,(long)iVar5 << 2);
    }
    p->pTrail = plVar2;
    sVar6 = (long)p->nVarsAlloc << 2;
    if (p->pAssigns == (lit *)0x0) {
      plVar2 = (lit *)malloc(sVar6);
    }
    else {
      plVar2 = (lit *)realloc(p->pAssigns,sVar6);
    }
    p->pAssigns = plVar2;
    if (p->pSeens == (char *)0x0) {
      pcVar3 = (char *)malloc((long)p->nVarsAlloc);
    }
    else {
      pcVar3 = (char *)realloc(p->pSeens,(long)p->nVarsAlloc);
    }
    p->pSeens = pcVar3;
    sVar6 = (long)p->nVarsAlloc << 3;
    if (p->pReasons == (Sto_Cls_t **)0x0) {
      ppSVar4 = (Sto_Cls_t **)malloc(sVar6);
    }
    else {
      ppSVar4 = (Sto_Cls_t **)realloc(p->pReasons,sVar6);
    }
    p->pReasons = ppSVar4;
    sVar6 = (long)p->nVarsAlloc << 4;
    if (p->pWatches == (Sto_Cls_t **)0x0) {
      ppSVar4 = (Sto_Cls_t **)malloc(sVar6);
    }
    else {
      ppSVar4 = (Sto_Cls_t **)realloc(p->pWatches,sVar6);
    }
    p->pWatches = ppSVar4;
    iVar1 = p->pCnf->nVars;
  }
  memset(p->pAssigns,0xff,(long)iVar1 << 2);
  memset(p->pSeens,0,(long)p->pCnf->nVars);
  memset(p->pReasons,0,(long)p->pCnf->nVars << 3);
  memset(p->pWatches,0,(long)p->pCnf->nVars << 4);
  iVar5 = p->nClosAlloc;
  iVar1 = p->pCnf->nClauses;
  if (iVar5 < iVar1) {
    if (iVar5 != 0) goto LAB_0071c83c;
    iVar5 = 1;
    while( true ) {
      p->nClosAlloc = iVar5;
LAB_0071c83c:
      if (iVar1 <= iVar5) break;
      iVar5 = iVar5 * 2;
    }
    if (p->pProofNums == (int *)0x0) {
      __s = (int *)malloc((long)iVar5 << 2);
    }
    else {
      __s = (int *)realloc(p->pProofNums,(long)iVar5 << 2);
      iVar1 = p->pCnf->nClauses;
    }
    p->pProofNums = __s;
  }
  else {
    __s = p->pProofNums;
  }
  memset(__s,0,(long)iVar1 << 2);
  return;
}

Assistant:

void Intp_ManResize( Intp_Man_t * p )
{
    // check if resizing is needed
    if ( p->nVarsAlloc < p->pCnf->nVars )
    {
        // find the new size
        if ( p->nVarsAlloc == 0 )
            p->nVarsAlloc = 1;
        while ( p->nVarsAlloc < p->pCnf->nVars ) 
            p->nVarsAlloc *= 2;
        // resize the arrays
        p->pTrail    = ABC_REALLOC(lit,         p->pTrail,    p->nVarsAlloc );
        p->pAssigns  = ABC_REALLOC(lit,         p->pAssigns,  p->nVarsAlloc );
        p->pSeens    = ABC_REALLOC(char,        p->pSeens,    p->nVarsAlloc );
//        p->pVarTypes = ABC_REALLOC(int,         p->pVarTypes, p->nVarsAlloc );
        p->pReasons  = ABC_REALLOC(Sto_Cls_t *, p->pReasons,  p->nVarsAlloc );
        p->pWatches  = ABC_REALLOC(Sto_Cls_t *, p->pWatches,  p->nVarsAlloc*2 );
    }

    // clean the free space
    memset( p->pAssigns , 0xff, sizeof(lit) * p->pCnf->nVars );
    memset( p->pSeens   , 0,    sizeof(char) * p->pCnf->nVars );
//    memset( p->pVarTypes, 0,    sizeof(int) * p->pCnf->nVars );
    memset( p->pReasons , 0,    sizeof(Sto_Cls_t *) * p->pCnf->nVars );
    memset( p->pWatches , 0,    sizeof(Sto_Cls_t *) * p->pCnf->nVars*2 );

    // check if resizing of clauses is needed
    if ( p->nClosAlloc < p->pCnf->nClauses )
    {
        // find the new size
        if ( p->nClosAlloc == 0 )
            p->nClosAlloc = 1;
        while ( p->nClosAlloc < p->pCnf->nClauses ) 
            p->nClosAlloc *= 2;
        // resize the arrays
        p->pProofNums = ABC_REALLOC( int, p->pProofNums,  p->nClosAlloc );
    }
    memset( p->pProofNums, 0, sizeof(int) * p->pCnf->nClauses );
}